

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::_performOptIRStable
          (SoPlexBase<double> *this,SolRational *sol,bool acceptUnbounded,bool acceptInfeasible,
          int minIRRoundsRemaining,bool *primalFeasible,bool *dualFeasible,bool *infeasible,
          bool *unbounded,bool *stoppedTime,bool *stoppedIter,bool *error)

{
  undefined1 *puVar1;
  Timer *pTVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  type_conflict5 tVar7;
  Verbosity VVar8;
  SPxStatus SVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined4 uVar13;
  SPxBasisBase<double> *pSVar14;
  char *pcVar15;
  RangeType *pRVar16;
  VarStatus *pVVar17;
  byte in_CL;
  byte in_DL;
  int __c;
  Rational *in_RSI;
  SoPlexBase<double> *in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *this_00;
  int in_R8D;
  SoPlexBase<double> *in_R9;
  longdouble lVar18;
  Rational *extraout_XMM0_Qa;
  SoPlexBase<double> *in_stack_00000008;
  undefined1 *in_stack_00000010;
  undefined1 *in_stack_00000018;
  SolRational *in_stack_00000020;
  SoPlexBase<double> *in_stack_00000028;
  SoPlexBase<double> *in_stack_00000030;
  int r_1;
  int numCorrectedPrimals;
  int primalSize;
  int simplifier;
  int prevIterations;
  int col;
  int row;
  int i;
  int numOrigCols;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  bool continueAfter;
  bool breakAfter;
  int nextRatrecRefinement;
  int lastStallRefinements;
  bool factorSolNewBasis;
  int maxDimRational;
  bool maximizing;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> basisStatusColsFirst;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> basisStatusRowsFirst;
  int numFailedRefinements;
  Rational errorCorrection;
  Rational errorCorrectionFactor;
  Rational violationImprovementFactor;
  Rational bestViolation;
  Rational maxViolation;
  int dualSize;
  int r;
  Verbosity old_verbosity;
  Rational maxScale;
  Rational dualScale;
  Rational primalScale;
  Rational dualViolation;
  Rational redCostViolation;
  Rational sideViolation;
  Rational boundsViolation;
  VectorBase<double> dualReal;
  VectorBase<double> primalReal;
  Status result;
  undefined4 in_stack_fffffffffffff718;
  undefined4 in_stack_fffffffffffff71c;
  undefined4 uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  undefined2 in_stack_fffffffffffff720;
  undefined2 uVar20;
  undefined2 in_stack_fffffffffffff722;
  undefined2 uVar21;
  undefined2 uVar22;
  undefined4 in_stack_fffffffffffff724;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined8 in_stack_fffffffffffff728;
  SolRational *sol_00;
  VectorBase<double> *in_stack_fffffffffffff730;
  SoPlexBase<double> *pSVar25;
  Rational *pRVar26;
  SoPlexBase<double> *sol_01;
  Statistics *pSVar27;
  SoPlexBase<double> *in_stack_fffffffffffff740;
  SolRational *in_stack_fffffffffffff748;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff750;
  undefined8 in_stack_fffffffffffff758;
  undefined8 in_stack_fffffffffffff760;
  SoPlexBase<double> *in_stack_fffffffffffff768;
  bool *in_stack_fffffffffffff770;
  undefined8 in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff784;
  uint in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  undefined4 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79c;
  undefined1 in_stack_fffffffffffff79d;
  undefined1 in_stack_fffffffffffff79e;
  undefined1 in_stack_fffffffffffff79f;
  undefined8 in_stack_fffffffffffff7a0;
  SoPlexBase<double> *in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7b0;
  int in_stack_fffffffffffff7b4;
  undefined4 in_stack_fffffffffffff7b8;
  undefined1 in_stack_fffffffffffff7bc;
  undefined1 in_stack_fffffffffffff7bd;
  undefined1 in_stack_fffffffffffff7be;
  undefined1 in_stack_fffffffffffff7bf;
  undefined8 in_stack_fffffffffffff7c0;
  Rational *in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7d0;
  VarStatus in_stack_fffffffffffff7d4;
  undefined2 in_stack_fffffffffffff7d8;
  undefined5 in_stack_fffffffffffff7da;
  undefined1 in_stack_fffffffffffff7df;
  undefined8 in_stack_fffffffffffff7e0;
  uint in_stack_fffffffffffff7e8;
  int in_stack_fffffffffffff7ec;
  int in_stack_fffffffffffff7f0;
  int in_stack_fffffffffffff7f4;
  undefined4 in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff7fc;
  undefined8 in_stack_fffffffffffff800;
  SoPlexBase<double> *in_stack_fffffffffffff808;
  undefined7 in_stack_fffffffffffff810;
  undefined1 in_stack_fffffffffffff817;
  undefined8 local_7e8;
  undefined8 in_stack_fffffffffffff820;
  undefined8 sol_02;
  undefined7 in_stack_fffffffffffff828;
  SPxSolverBase<double> *solver;
  undefined7 in_stack_fffffffffffff838;
  undefined8 in_stack_fffffffffffff858;
  undefined8 in_stack_fffffffffffff878;
  undefined8 in_stack_fffffffffffff880;
  SPxOut *in_stack_fffffffffffff888;
  SPxOut *in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff898;
  int in_stack_fffffffffffff89c;
  SoPlexBase<double> *in_stack_fffffffffffff8a0;
  TYPE local_6d8;
  undefined4 local_600;
  int local_5fc;
  int local_5f8;
  DataArray<int> local_5f0;
  undefined8 local_5d8;
  int local_5d0;
  int local_5cc;
  char *local_5c8;
  SPxStatus local_5c0;
  SPxStatus local_5bc;
  int local_5b8;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  Verbosity local_5a8;
  Verbosity local_5a4;
  double local_5a0;
  double local_598;
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  Verbosity local_510;
  Verbosity local_50c;
  undefined1 local_506;
  bool local_505 [5];
  int local_500;
  undefined1 local_4f9;
  TYPE local_4f8;
  byte local_4f1;
  undefined4 local_4c0;
  undefined1 local_4bc [76];
  Timer *local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468 [2];
  undefined4 local_41c;
  SPxOut local_418;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_fffffffffffffc08;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_fffffffffffffc10;
  VectorBase<double> *in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  bool in_stack_fffffffffffffc2f;
  SoPlexBase<double> *in_stack_fffffffffffffc30;
  undefined1 local_398 [80];
  undefined4 local_348;
  int local_344;
  Verbosity local_340;
  Verbosity local_33c;
  VectorBase<double> local_338 [2];
  UpdateVector<double> local_2f8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  local_278;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  local_238;
  undefined1 local_1f8 [204];
  Status local_12c;
  SoPlexBase<double> *local_128;
  int local_120;
  byte local_11a;
  byte local_119;
  Rational *local_118;
  DataKey *local_108;
  pointer local_100;
  pointer local_f8;
  DLPSV *local_f0;
  DLPSV *local_e8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_e0;
  VectorBase<double> *local_d8;
  UpdateVector<double> *local_d0;
  VectorBase<double> *local_c8;
  UpdateVector<double> *local_c0;
  VectorBase<double> *local_b8;
  UpdateVector<double> *local_b0;
  UpdateVector<double> *local_a8;
  UpdateVector<double> *local_a0;
  UpdateVector<double> *local_98;
  VectorBase<double> *local_90;
  VectorBase<double> *local_78;
  Timer **local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  pointer local_60;
  pointer local_58;
  SPxScaler<double> *local_50;
  SPxOut *local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  _func_int **local_30;
  SPxSolverBase<double> *local_28;
  _func_int **local_20;
  SPxScaler<double> *local_18;
  Timer **local_10;
  
  iVar10 = SUB84(in_stack_fffffffffffff728,4);
  local_119 = in_DL & 1;
  local_11a = in_CL & 1;
  pTVar2 = in_RDI->_statistics->rationalTime;
  local_128 = in_R9;
  local_120 = in_R8D;
  local_118 = in_RSI;
  (*pTVar2->_vptr_Timer[3])(pTVar2,in_RSI,in_stack_00000008);
  *(undefined1 *)
   &(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
       *)&local_128->_vptr_SoPlexBase)->m_value).num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data = 0;
  *(undefined1 *)
   &(((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       *)&in_stack_00000008->_vptr_SoPlexBase)->val).
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  *in_stack_00000010 = 0;
  *in_stack_00000018 = 0;
  *(undefined1 *)
   &(((rational_type *)&in_stack_00000020->_primal)->num).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data = 0;
  *(undefined1 *)
   &(((rational_type *)&in_stack_00000028->_vptr_SoPlexBase)->num).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data = 0;
  *(undefined1 *)
   &(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
       *)&in_stack_00000030->_vptr_SoPlexBase)->m_value).num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data = 0;
  local_12c = 0;
  numColsRational((SoPlexBase<double> *)0x465786);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT17(in_stack_fffffffffffff7bf,
                      CONCAT16(in_stack_fffffffffffff7be,
                               CONCAT15(in_stack_fffffffffffff7bd,
                                        CONCAT14(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8
                                                )))),in_stack_fffffffffffff7b4,
          SUB41(in_stack_fffffffffffff7b0,3));
  numColsRational((SoPlexBase<double> *)0x4657bc);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT17(in_stack_fffffffffffff7bf,
                      CONCAT16(in_stack_fffffffffffff7be,
                               CONCAT15(in_stack_fffffffffffff7bd,
                                        CONCAT14(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8
                                                )))),in_stack_fffffffffffff7b4,
          SUB41(in_stack_fffffffffffff7b0,3));
  numRowsRational((SoPlexBase<double> *)0x4657f0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT17(in_stack_fffffffffffff7bf,
                      CONCAT16(in_stack_fffffffffffff7be,
                               CONCAT15(in_stack_fffffffffffff7bd,
                                        CONCAT14(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8
                                                )))),in_stack_fffffffffffff7b4,
          SUB41(in_stack_fffffffffffff7b0,3));
  numRowsRational((SoPlexBase<double> *)0x465824);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT17(in_stack_fffffffffffff7bf,
                      CONCAT16(in_stack_fffffffffffff7be,
                               CONCAT15(in_stack_fffffffffffff7bd,
                                        CONCAT14(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8
                                                )))),in_stack_fffffffffffff7b4,
          SUB41(in_stack_fffffffffffff7b0,3));
  numColsRational((SoPlexBase<double> *)0x465858);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT17(in_stack_fffffffffffff7bf,
                      CONCAT16(in_stack_fffffffffffff7be,
                               CONCAT15(in_stack_fffffffffffff7bd,
                                        CONCAT14(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8
                                                )))),in_stack_fffffffffffff7b4,
          SUB41(in_stack_fffffffffffff7b0,3));
  numColsRational((SoPlexBase<double> *)0x46587b);
  VectorBase<double>::VectorBase(in_stack_fffffffffffff730,iVar10);
  numRowsRational((SoPlexBase<double> *)0x465897);
  VectorBase<double>::VectorBase(in_stack_fffffffffffff730,iVar10);
  local_f8 = (pointer)(local_1f8 + 0x40);
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x4658d3);
  local_f0 = (DLPSV *)local_1f8;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x4658f4);
  local_e8 = (DLPSV *)&local_238;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x465915);
  local_e0 = &local_278;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x465936);
  local_d8 = &local_2f8.thedelta.super_VectorBase<double>;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x465957);
  local_d0 = &local_2f8;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x465978);
  local_c8 = local_338;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x465999);
  if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
     (VVar8 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar8)) {
    local_33c = SPxOut::getVerbosity(&in_RDI->spxout);
    local_340 = INFO1;
    SPxOut::setVerbosity(&in_RDI->spxout,&local_340);
    soplex::operator<<((SPxOut *)
                       CONCAT44(in_stack_fffffffffffff724,
                                CONCAT22(in_stack_fffffffffffff722,in_stack_fffffffffffff720)),
                       (char *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
    SPxOut::setVerbosity(&in_RDI->spxout,&local_33c);
  }
  if ((in_RDI->_hasBasis & 1U) != 0) {
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_const_ptr(&in_RDI->_basisStatusRows);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_const_ptr(&in_RDI->_basisStatusCols);
    SPxSolverBase<double>::setBasis
              ((SPxSolverBase<double> *)in_stack_fffffffffffff7a0,
               (VarStatus *)
               CONCAT17(in_stack_fffffffffffff79f,
                        CONCAT16(in_stack_fffffffffffff79e,
                                 CONCAT15(in_stack_fffffffffffff79d,
                                          CONCAT14(in_stack_fffffffffffff79c,
                                                   in_stack_fffffffffffff798)))),
               (VarStatus *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
    pSVar14 = SPxSolverBase<double>::basis(&in_RDI->_solver);
    SVar9 = SPxBasisBase<double>::status(pSVar14);
    in_RDI->_hasBasis = NO_PROBLEM < SVar9;
  }
  local_344 = numRowsRational((SoPlexBase<double> *)0x465bdc);
  do {
    local_344 = local_344 + -1;
  } while (-1 < local_344);
  (*in_RDI->_statistics->rationalTime->_vptr_Timer[4])();
  bVar3 = boolParam(in_RDI,RECOVERY_MECHANISM);
  if (bVar3) {
    local_12c = _solveRealStable((SoPlexBase<double> *)
                                 CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                                 SUB81((ulong)in_stack_fffffffffffff808 >> 0x38,0),
                                 SUB81((ulong)in_stack_fffffffffffff808 >> 0x30,0),
                                 (VectorBase<double> *)in_stack_fffffffffffff800,
                                 (VectorBase<double> *)
                                 CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                                 (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                                 CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                 (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                                 in_stack_fffffffffffff820,
                                 SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
  }
  else {
    local_12c = _solveRealForRational
                          (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2f,
                           (VectorBase<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18
                           ,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  }
  uVar21 = (undefined2)((ulong)in_stack_00000018 >> 0x10);
  uVar23 = (undefined4)((ulong)in_stack_00000018 >> 0x20);
  uVar13 = SUB84(in_stack_00000010,0);
  uVar19 = (undefined4)((ulong)in_stack_00000010 >> 0x20);
  uVar20 = (short)in_stack_00000018;
  uVar22 = uVar21;
  uVar24 = uVar23;
  sol_00 = in_stack_00000020;
  pSVar25 = in_stack_00000028;
  sol_01 = in_stack_00000030;
  bVar3 = _evaluateResult<double>
                    ((SoPlexBase<double> *)in_stack_fffffffffffff758,
                     (SPxSolverBase<double> *)in_stack_fffffffffffff750._M_pi,
                     (Status)((ulong)in_stack_fffffffffffff748 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffff748 >> 0x18,0),
                     (SolRational *)in_stack_fffffffffffff740,
                     (VectorBase<double> *)in_stack_00000030,in_stack_fffffffffffff770,
                     (bool *)in_stack_fffffffffffff778,
                     (bool *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                     (bool *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                     (bool *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
  if (bVar3) {
    local_348 = 1;
  }
  else {
    (*in_RDI->_statistics->rationalTime->_vptr_Timer[3])();
    local_398._76_4_ = 0;
    _storeRealSolutionAsRational<double>
              ((SoPlexBase<double> *)
               CONCAT17(in_stack_fffffffffffff7bf,
                        CONCAT16(in_stack_fffffffffffff7be,
                                 CONCAT15(in_stack_fffffffffffff7bd,
                                          CONCAT14(in_stack_fffffffffffff7bc,
                                                   in_stack_fffffffffffff7b8)))),
               (SolRational *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
               (VectorBase<double> *)in_stack_fffffffffffff7a8,
               (VectorBase<double> *)in_stack_fffffffffffff7a0,
               (int *)CONCAT17(in_stack_fffffffffffff79f,
                               CONCAT16(in_stack_fffffffffffff79e,
                                        CONCAT15(in_stack_fffffffffffff79d,
                                                 CONCAT14(in_stack_fffffffffffff79c,
                                                          in_stack_fffffffffffff798)))));
    local_98 = (UpdateVector<double> *)&in_RDI->_rationalPosone;
    local_90 = &local_2f8.thedelta.super_VectorBase<double>;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),
                (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(uVar19,uVar13));
    local_a8 = (UpdateVector<double> *)&in_RDI->_rationalPosone;
    local_a0 = &local_2f8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),
                (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(uVar19,uVar13));
    local_c0 = (UpdateVector<double> *)local_398;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x465e81);
    local_108 = (DataKey *)&in_RDI->_rationalPosInfty;
    local_100 = (pointer)&stack0xfffffffffffffc28;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)pSVar25,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)sol_00);
    local_41c = 0x10;
    local_48 = &local_418;
    local_50 = (SPxScaler<double> *)&stack0xfffffffffffffbe4;
    local_58 = (pointer)0x0;
    local_60 = (pointer)0x10;
    local_18 = local_50;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor<long_long>
              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                *)in_stack_fffffffffffff778,(longlong *)in_stack_fffffffffffff770,
               in_stack_fffffffffffff768);
    local_470 = (Timer *)0x3ff199999999999a;
    local_68 = local_468;
    local_70 = &local_470;
    local_78 = (VectorBase<double> *)0x0;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x465f8c);
    local_10 = local_70;
    lVar18 = (longdouble)(double)*local_70;
    uVar13 = SUB104(lVar18,0);
    uVar19 = (undefined4)((unkuint10)lVar18 >> 0x20);
    uVar20 = (undefined2)((unkuint10)lVar18 >> 0x40);
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                (longdouble)
                CONCAT28(in_stack_fffffffffffff7d8,
                         CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)));
    local_4bc._0_4_ = 2;
    local_28 = (SPxSolverBase<double> *)(local_4bc + 4);
    local_30 = (_func_int **)local_4bc;
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40 = (element_type *)0x2;
    local_20 = local_30;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor<long_long>
              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                *)in_stack_fffffffffffff778,(longlong *)in_stack_fffffffffffff770,
               in_stack_fffffffffffff768);
    local_4c0 = 0;
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)pSVar25,
               (int)((ulong)sol_00 >> 0x20),(Verbosity)sol_00,
               (Real)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)));
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)pSVar25,
               (int)((ulong)sol_00 >> 0x20),(Verbosity)sol_00,
               (Real)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)));
    iVar10 = intParam(in_RDI,OBJSENSE);
    local_4f1 = iVar10 == 1;
    iVar10 = numColsRational((SoPlexBase<double> *)0x4660e1);
    iVar11 = numRowsRational((SoPlexBase<double> *)0x4660f7);
    if (iVar11 < iVar10) {
      local_6d8 = numColsRational((SoPlexBase<double> *)0x46611f);
    }
    else {
      local_6d8 = numRowsRational((SoPlexBase<double> *)0x466145);
    }
    t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar19,uVar13)
    ;
    local_4f8 = local_6d8;
    local_4f9 = 1;
    local_500 = 0;
    local_505[1] = false;
    local_505[2] = false;
    local_505[3] = false;
    local_505[4] = false;
    while( true ) {
      uVar13 = (undefined4)((ulong)sol_01 >> 0x20);
      local_120 = local_120 + -1;
      SPxOut::debug<soplex::SoPlexBase<double>,_const_char_(&)[30],_0>
                (in_RDI,(char (*) [30])"Computing primal violations.\n");
      _computeBoundsViolation
                (in_stack_fffffffffffff7a8,(SolRational *)in_stack_fffffffffffff7a0,
                 (Rational *)
                 CONCAT17(in_stack_fffffffffffff79f,
                          CONCAT16(in_stack_fffffffffffff79e,
                                   CONCAT15(in_stack_fffffffffffff79d,
                                            CONCAT14(in_stack_fffffffffffff79c,
                                                     in_stack_fffffffffffff798)))));
      _computeSidesViolation
                ((SoPlexBase<double> *)
                 CONCAT17(in_stack_fffffffffffff7bf,
                          CONCAT16(in_stack_fffffffffffff7be,
                                   CONCAT15(in_stack_fffffffffffff7bd,
                                            CONCAT14(in_stack_fffffffffffff7bc,
                                                     in_stack_fffffffffffff7b8)))),
                 (SolRational *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (Rational *)in_stack_fffffffffffff7a8);
      SPxOut::debug<soplex::SoPlexBase<double>,_const_char_(&)[28],_0>
                (in_RDI,(char (*) [28])"Computing dual violations.\n");
      _computeReducedCostViolation
                (in_stack_fffffffffffff808,(SolRational *)in_stack_fffffffffffff800,
                 (Rational *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                 (bool *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
      _computeDualViolation
                (in_stack_fffffffffffff808,(SolRational *)in_stack_fffffffffffff800,
                 (Rational *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                 (bool *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),
                  (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)t);
      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
         (VVar8 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar8)) {
        local_50c = SPxOut::getVerbosity(&in_RDI->spxout);
        local_510 = INFO1;
        SPxOut::setVerbosity(&in_RDI->spxout,&local_510);
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(char *)t);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)sol_00,CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),
                         (fmtflags)((ulong)t >> 0x20));
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),t);
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(char *)t);
        orderOfMagnitude((Rational *)in_stack_fffffffffffff858);
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),
                           (int)((ulong)t >> 0x20));
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(char *)t);
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(char *)t);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)sol_00,CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),
                         (fmtflags)((ulong)t >> 0x20));
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),t);
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(char *)t);
        orderOfMagnitude((Rational *)in_stack_fffffffffffff858);
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),
                           (int)((ulong)t >> 0x20));
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(char *)t);
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(char *)t);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)sol_00,CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),
                         (fmtflags)((ulong)t >> 0x20));
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),t);
        in_stack_fffffffffffff8a0 =
             (SoPlexBase<double> *)
             soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(char *)t);
        in_stack_fffffffffffff89c = orderOfMagnitude((Rational *)in_stack_fffffffffffff858);
        in_stack_fffffffffffff890 =
             soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),
                                (int)((ulong)t >> 0x20));
        in_stack_fffffffffffff888 =
             soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(char *)t);
        in_stack_fffffffffffff880 =
             soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(char *)t);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)sol_00,CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),
                         (fmtflags)((ulong)t >> 0x20));
        in_stack_fffffffffffff878 =
             soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),t);
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(char *)t);
        orderOfMagnitude((Rational *)in_stack_fffffffffffff858);
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),
                           (int)((ulong)t >> 0x20));
        soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(char *)t);
        std::__cxx11::string::~string(local_590);
        std::__cxx11::string::~string(local_570);
        std::__cxx11::string::~string(local_550);
        std::__cxx11::string::~string(local_530);
        SPxOut::setVerbosity(&in_RDI->spxout,&local_50c);
      }
      pSVar27 = in_RDI->_statistics;
      (*pSVar27->solvingTime->_vptr_Timer[6])();
      in_stack_fffffffffffff858 = extraout_XMM0_Qa;
      (*in_RDI->_statistics->rationalTime->_vptr_Timer[6])();
      uVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)t,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                               *)0x466859);
      if ((bool)uVar4) {
        sol_02 = local_1f8 + 0x40;
      }
      else {
        sol_02 = local_1f8;
      }
      solver = (SPxSolverBase<double> *)sol_02;
      uVar5 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)t,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                               *)0x4668b8);
      if ((bool)uVar5) {
        local_7e8 = &local_238;
      }
      else {
        local_7e8 = &local_278;
      }
      uVar24 = (undefined4)((ulong)local_7e8 >> 0x20);
      SPxOut::
      debug<soplex::SoPlexBase<double>,_const_char_(&)[45],_int_&,_int_&,_double,_double,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_&,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_&,_0>
                (in_RDI,(char (*) [45])"Progress table: {} & {} & {} & {} & {} & {}\n",
                 &pSVar27->refinements,&pSVar27->iterations,&local_598,&local_5a0,
                 (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                  *)sol_02,
                 (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                  *)local_7e8);
      pSVar27 = (Statistics *)CONCAT44(uVar13,local_4c0);
      uVar20 = (undefined2)local_120;
      uVar22 = (undefined2)((uint)local_120 >> 0x10);
      t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278;
      sol_00 = in_stack_00000020;
      pSVar25 = in_stack_00000028;
      uVar6 = _isRefinementOver(in_stack_fffffffffffff768,(bool *)in_stack_fffffffffffff760,
                                (bool *)in_stack_fffffffffffff758,
                                (Rational *)in_stack_fffffffffffff750._M_pi,
                                (Rational *)in_stack_fffffffffffff748,
                                (Rational *)in_stack_fffffffffffff740,
                                (Rational *)
                                CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                                in_stack_fffffffffffff788,
                                (bool *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790
                                                ),
                                (bool *)CONCAT17(in_stack_fffffffffffff79f,
                                                 CONCAT16(in_stack_fffffffffffff79e,
                                                          CONCAT15(in_stack_fffffffffffff79d,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff79c,
                                                  in_stack_fffffffffffff798)))),
                                (int)in_stack_fffffffffffff7a0);
      if ((bool)uVar6) break;
      _checkRefinementProgress
                ((SoPlexBase<double> *)in_stack_fffffffffffff758,
                 (Rational *)in_stack_fffffffffffff750._M_pi,(Rational *)in_stack_fffffffffffff748,
                 (Rational *)in_stack_fffffffffffff740,(Rational *)pSVar27,(Rational *)pSVar25,
                 (Rational *)in_stack_fffffffffffff7e0,
                 (Rational *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                 (int *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
      in_stack_fffffffffffff768 = (SoPlexBase<double> *)&local_506;
      in_stack_fffffffffffff760 = local_505;
      sol_00 = (SolRational *)local_398;
      puVar1 = local_4bc + 4;
      uVar20 = SUB82(puVar1,0);
      uVar22 = (undefined2)((ulong)puVar1 >> 0x10);
      uVar24 = (undefined4)((ulong)puVar1 >> 0x20);
      t = local_468;
      pRVar26 = local_118;
      sol_01 = local_128;
      in_stack_fffffffffffff740 = in_stack_00000008;
      in_stack_fffffffffffff748 = in_stack_00000020;
      in_stack_fffffffffffff750._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_00000028;
      in_stack_fffffffffffff758 = in_stack_00000030;
      in_stack_fffffffffffff808 = (SoPlexBase<double> *)&stack0xfffffffffffff718;
      _ratrecAndOrRatfac((SoPlexBase<double> *)
                         CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                         (int *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0,
                         (int *)CONCAT17(in_stack_fffffffffffff79f,
                                         CONCAT16(in_stack_fffffffffffff79e,
                                                  CONCAT15(in_stack_fffffffffffff79d,
                                                           CONCAT14(in_stack_fffffffffffff79c,
                                                                    in_stack_fffffffffffff798)))),
                         (bool *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                         (int *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                         (Rational *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7c8,
                         (Rational *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                         (SolRational *)
                         CONCAT17(in_stack_fffffffffffff7df,
                                  CONCAT52(in_stack_fffffffffffff7da,in_stack_fffffffffffff7d8)),
                         (bool *)in_stack_fffffffffffff7e0,
                         (bool *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                         (bool *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                         (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                         (bool *)in_stack_fffffffffffff800,(bool *)&stack0xfffffffffffff718,
                         (bool *)CONCAT17(uVar6,in_stack_fffffffffffff810));
      if ((local_505[0] & 1U) != 0) break;
      if ((local_506 & 1) == 0) {
        _computePrimalScalingFactor
                  ((SoPlexBase<double> *)in_stack_fffffffffffff750._M_pi,
                   (Rational *)in_stack_fffffffffffff748,(Rational *)in_stack_fffffffffffff740,
                   (Rational *)sol_01,pRVar26,(Rational *)sol_00);
        _applyScaledBounds<double>
                  ((SoPlexBase<double> *)CONCAT17(uVar4,in_stack_fffffffffffff838),solver,
                   (Rational *)CONCAT17(uVar5,in_stack_fffffffffffff828));
        _applyScaledSides<double>
                  ((SoPlexBase<double> *)
                   CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                   (SPxSolverBase<double> *)in_stack_fffffffffffff7a8,
                   (Rational *)in_stack_fffffffffffff7a0);
        _computeDualScalingFactor
                  ((SoPlexBase<double> *)
                   CONCAT17(in_stack_fffffffffffff7bf,
                            CONCAT16(in_stack_fffffffffffff7be,
                                     CONCAT15(in_stack_fffffffffffff7bd,
                                              CONCAT14(in_stack_fffffffffffff7bc,
                                                       in_stack_fffffffffffff7b8)))),
                   (Rational *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                   (Rational *)in_stack_fffffffffffff7a8,(Rational *)in_stack_fffffffffffff7a0,
                   (Rational *)
                   CONCAT17(in_stack_fffffffffffff79f,
                            CONCAT16(in_stack_fffffffffffff79e,
                                     CONCAT15(in_stack_fffffffffffff79d,
                                              CONCAT14(in_stack_fffffffffffff79c,
                                                       in_stack_fffffffffffff798)))),
                   (Rational *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
        _applyScaledObj<double>
                  ((SoPlexBase<double> *)CONCAT17(uVar4,in_stack_fffffffffffff838),solver,
                   (Rational *)CONCAT17(uVar5,in_stack_fffffffffffff828),(SolRational *)sol_02);
        if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
           (VVar8 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar8)) {
          in_stack_fffffffffffff800 = &in_RDI->spxout;
          local_5a4 = SPxOut::getVerbosity((SPxOut *)in_stack_fffffffffffff800);
          local_5a8 = INFO1;
          SPxOut::setVerbosity((SPxOut *)in_stack_fffffffffffff800,&local_5a8);
          soplex::operator<<((SPxOut *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(char *)t);
          SPxOut::setVerbosity(&in_RDI->spxout,&local_5a4);
        }
        in_stack_fffffffffffff7fc =
             LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             ::num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)0x466ca3);
        if ((0 < (int)in_stack_fffffffffffff7fc) && ((in_RDI->_hasBasis & 1U) != 0)) {
          in_stack_fffffffffffff7f8 = numColsRational((SoPlexBase<double> *)0x466cde);
          in_stack_fffffffffffff7f4 =
               LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               ::num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)0x466cfb);
          local_5ac = in_stack_fffffffffffff7f8 - in_stack_fffffffffffff7f4;
          local_5b0 = 0;
          while( true ) {
            in_stack_fffffffffffff7ec = local_5b0;
            in_stack_fffffffffffff7f0 =
                 LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ::num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)0x466d48);
            if (in_stack_fffffffffffff7f0 <= in_stack_fffffffffffff7ec) break;
            in_stack_fffffffffffff7e0 =
                 LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ::colVector((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                              *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(int)((ulong)t >> 0x20));
            pcVar15 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)in_stack_fffffffffffff7e0,(char *)0x0,__c);
            local_5b4 = (int)pcVar15;
            local_5b8 = local_5ac + local_5b0;
            pVVar17 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                (&in_RDI->_basisStatusRows,local_5b4);
            if ((*pVVar17 == BASIC) &&
               (pVVar17 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                    (&in_RDI->_basisStatusCols,local_5b8), *pVVar17 != BASIC)) {
              this_00 = &in_RDI->_basisStatusCols;
              in_stack_fffffffffffff7d8 = SUB82(this_00,0);
              in_stack_fffffffffffff7da = (undefined5)((ulong)this_00 >> 0x10);
              in_stack_fffffffffffff7df = (undefined1)((ulong)this_00 >> 0x38);
              pVVar17 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                  (this_00,local_5b8);
              in_stack_fffffffffffff7d4 = *pVVar17;
              pVVar17 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                  (&in_RDI->_basisStatusRows,local_5b4);
              *pVVar17 = in_stack_fffffffffffff7d4;
              pVVar17 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                  ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                                   CONCAT17(in_stack_fffffffffffff7df,
                                            CONCAT52(in_stack_fffffffffffff7da,
                                                     in_stack_fffffffffffff7d8)),local_5b8);
              *pVVar17 = BASIC;
              SLUFactorRational::clear
                        ((SLUFactorRational *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)));
            }
            local_5b0 = local_5b0 + 1;
          }
        }
        if ((in_RDI->_hasBasis & 1U) != 0) {
          pSVar14 = SPxSolverBase<double>::basis(&in_RDI->_solver);
          SVar9 = SPxBasisBase<double>::status(pSVar14);
          if (SVar9 < REGULAR) {
            pSVar14 = SPxSolverBase<double>::basis(&in_RDI->_solver);
            local_5bc = SPxBasisBase<double>::status(pSVar14);
            SPxOut::
            debug<soplex::SoPlexBase<double>,_const_char_(&)[38],_soplex::SPxBasisBase<double>::SPxStatus,_0>
                      (in_RDI,(char (*) [38])"basis (status = {}) desc before set:\n",&local_5bc);
            in_stack_fffffffffffff7c0 = &in_RDI->_solver;
            in_stack_fffffffffffff7c8 =
                 (Rational *)
                 DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_const_ptr
                           (&in_RDI->_basisStatusRows);
            DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_const_ptr
                      (&in_RDI->_basisStatusCols);
            SPxSolverBase<double>::setBasis
                      ((SPxSolverBase<double> *)in_stack_fffffffffffff7a0,
                       (VarStatus *)
                       CONCAT17(in_stack_fffffffffffff79f,
                                CONCAT16(in_stack_fffffffffffff79e,
                                         CONCAT15(in_stack_fffffffffffff79d,
                                                  CONCAT14(in_stack_fffffffffffff79c,
                                                           in_stack_fffffffffffff798)))),
                       (VarStatus *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
            pSVar14 = SPxSolverBase<double>::basis(&in_RDI->_solver);
            local_5c0 = SPxBasisBase<double>::status(pSVar14);
            SPxOut::
            debug<soplex::SoPlexBase<double>,_const_char_(&)[37],_soplex::SPxBasisBase<double>::SPxStatus,_0>
                      (in_RDI,(char (*) [37])"basis (status = {}) desc after set:\n",&local_5c0);
            pSVar14 = SPxSolverBase<double>::basis(&in_RDI->_solver);
            SVar9 = SPxBasisBase<double>::status(pSVar14);
            in_RDI->_hasBasis = NO_PROBLEM < SVar9;
            local_5c8 = "failed";
            if ((in_RDI->_hasBasis & 1U) != 0) {
              local_5c8 = "successful";
            }
            SPxOut::debug<soplex::SoPlexBase<double>,_const_char_(&)[32],_const_char_*,_0>
                      (in_RDI,(char (*) [32])"setting basis in solver {} (3)\n",&local_5c8);
          }
        }
        local_5cc = in_RDI->_statistics->iterations;
        (*in_RDI->_statistics->rationalTime->_vptr_Timer[4])();
        bVar3 = boolParam(in_RDI,RECOVERY_MECHANISM);
        if (bVar3) {
          in_stack_fffffffffffff7a0 = &in_RDI->_basisStatusRows;
          in_stack_fffffffffffff7a8 = (SoPlexBase<double> *)&in_RDI->_basisStatusCols;
          local_5f0.data = (int *)0x4415af1d78b58c40;
          in_stack_fffffffffffff79e = local_119;
          in_stack_fffffffffffff79f = local_11a;
          tVar7 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)sol_00,(double *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)));
          in_stack_fffffffffffff7b4 = CONCAT13(tVar7,(int3)in_stack_fffffffffffff7b4);
          in_stack_fffffffffffff79d = true;
          if (!tVar7) {
            local_5f0.thesize = 0x78b58c40;
            local_5f0.themax = 0x4415af1d;
            in_stack_fffffffffffff79c =
                 boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                             *)sol_00,(double *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)));
            in_stack_fffffffffffff79d = in_stack_fffffffffffff79c;
          }
          in_stack_fffffffffffff798 =
               _solveRealStable((SoPlexBase<double> *)CONCAT17(uVar6,in_stack_fffffffffffff810),
                                SUB81((ulong)in_stack_fffffffffffff808 >> 0x38,0),
                                SUB81((ulong)in_stack_fffffffffffff808 >> 0x30,0),
                                (VectorBase<double> *)in_stack_fffffffffffff800,
                                (VectorBase<double> *)
                                CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                                (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                                CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                (DataArray<soplex::SPxSolverBase<double>::VarStatus> *)sol_02,
                                SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
          local_12c = in_stack_fffffffffffff798;
        }
        else {
          local_5d0 = intParam(in_RDI,SIMPLIFIER);
          local_5d8._0_4_ = 0x78b58c40;
          local_5d8._4_4_ = 0x4415af1d;
          in_stack_fffffffffffff7bf =
               boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)sol_00,(double *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)));
          in_stack_fffffffffffff7be = true;
          if (!(bool)in_stack_fffffffffffff7bf) {
            local_5f0.memFactor = 1e+20;
            in_stack_fffffffffffff7bd =
                 boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                             *)sol_00,(double *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)));
            in_stack_fffffffffffff7be = in_stack_fffffffffffff7bd;
          }
          if ((type_conflict5)in_stack_fffffffffffff7be != false) {
            setIntParam((SoPlexBase<double> *)
                        CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                        (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20),
                        (int)in_stack_fffffffffffff7e0,(bool)in_stack_fffffffffffff7df);
          }
          in_stack_fffffffffffff7b8 =
               _solveRealForRational
                         (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2f,
                          (VectorBase<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                          in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          local_12c = in_stack_fffffffffffff7b8;
          setIntParam((SoPlexBase<double> *)
                      CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                      (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20),(int)in_stack_fffffffffffff7e0
                      ,(bool)in_stack_fffffffffffff7df);
        }
        in_RDI->_statistics->refinements = in_RDI->_statistics->refinements + 1;
        if (local_5cc < in_RDI->_statistics->iterations) {
          local_4f9 = 1;
          local_500 = 0;
          in_RDI->_statistics->pivotRefinements = in_RDI->_statistics->refinements;
        }
        else {
          local_500 = local_500 + 1;
          in_RDI->_statistics->stallRefinements = in_RDI->_statistics->stallRefinements + 1;
        }
        uVar20 = (short)in_stack_00000018;
        uVar22 = uVar21;
        uVar24 = uVar23;
        sol_00 = in_stack_00000020;
        pSVar25 = in_stack_00000028;
        sol_01 = in_stack_00000030;
        bVar3 = _evaluateResult<double>
                          ((SoPlexBase<double> *)in_stack_fffffffffffff758,
                           (SPxSolverBase<double> *)in_stack_fffffffffffff750._M_pi,
                           (Status)((ulong)in_stack_fffffffffffff748 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffff748 >> 0x18,0),
                           (SolRational *)in_stack_fffffffffffff740,
                           (VectorBase<double> *)in_stack_00000030,in_stack_fffffffffffff770,
                           (bool *)in_stack_fffffffffffff778,
                           (bool *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                           (bool *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                           (bool *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
        in_stack_fffffffffffff794._3_1_ = bVar3;
        if (bVar3) {
          local_348 = 1;
          goto LAB_0046775a;
        }
        (*in_RDI->_statistics->rationalTime->_vptr_Timer[3])();
        _correctPrimalSolution<double>
                  (in_stack_fffffffffffff8a0,
                   (SolRational *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                   (Rational *)in_stack_fffffffffffff890,(int *)in_stack_fffffffffffff888,
                   (int *)in_stack_fffffffffffff880,(VectorBase<double> *)in_stack_fffffffffffff878)
        ;
        _updateSlacks(pSVar25,sol_00,(int *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)));
        local_5f8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    ::size(&(in_RDI->_primalDualDiff).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          );
        uVar20 = SUB82(&local_4f8,0);
        uVar22 = (undefined2)((ulong)&local_4f8 >> 0x10);
        uVar24 = (undefined4)((ulong)&local_4f8 >> 0x20);
        t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_398 + 0x4c);
        _correctDualSolution<double>
                  ((SoPlexBase<double> *)
                   CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                   (SPxSolverBase<double> *)
                   CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                   (SolRational *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                   (bool *)in_stack_fffffffffffff7e0,
                   (VectorBase<double> *)
                   CONCAT17(in_stack_fffffffffffff7df,
                            CONCAT52(in_stack_fffffffffffff7da,in_stack_fffffffffffff7d8)),
                   (Rational *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                   (int *)solver,(int *)CONCAT17(uVar4,in_stack_fffffffffffff838));
        _updateReducedCosts(in_stack_fffffffffffff740,(SolRational *)sol_01,(int *)pSVar25,
                            (int *)sol_00);
      }
    }
    if ((in_RDI->_hasBasis & 1U) != 0) {
      local_5fc = numRowsRational((SoPlexBase<double> *)0x46752e);
      while (local_5fc = local_5fc + -1, -1 < local_5fc) {
        pRVar16 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                            (&in_RDI->_rowTypes,local_5fc);
        if (*pRVar16 != RANGETYPE_FIXED) {
          pVVar17 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                              (&in_RDI->_basisStatusRows,local_5fc);
          if (*pVVar17 == FIXED) {
            uVar12 = local_4f1 & 1;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),(int)((ulong)t >> 0x20));
            local_600 = 0;
            tVar7 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)sol_00,(int *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)));
            uVar13 = ZEXT14(uVar12 == tVar7);
            pVVar17 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                (&in_RDI->_basisStatusRows,local_5fc);
            *pVVar17 = uVar13;
          }
        }
      }
    }
    if ((local_118[3].m_backend.m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_limbs & 1) != 0) {
      pRVar26 = local_118;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x467675);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator*((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)pRVar26,
                  (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)in_stack_fffffffffffff768);
      local_b0 = (UpdateVector<double> *)
                 &local_118[2].m_backend.m_value.num.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_limbs;
      local_b8 = (VectorBase<double> *)&stack0xfffffffffffff9b8;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)),
                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)t);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x4676dd);
      iVar10 = intParam(in_RDI,OBJSENSE);
      if (iVar10 == -1) {
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)sol_00,(int *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)));
      }
    }
    SPxSolverBase<double>::clearRowObjs
              ((SPxSolverBase<double> *)CONCAT44(uVar24,CONCAT22(uVar22,uVar20)));
    (*in_RDI->_statistics->rationalTime->_vptr_Timer[4])();
    local_348 = 0;
LAB_0046775a:
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::~DataArray
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
               CONCAT44(uVar24,CONCAT22(uVar22,uVar20)));
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::~DataArray
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
               CONCAT44(uVar24,CONCAT22(uVar22,uVar20)));
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x467781);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x46778e);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x46779b);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x4677a8);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x4677b5);
  }
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x4677c2);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x4677cf);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x4677dc);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x4677e9);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x4677f6);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x467803);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x467810);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x46781d);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x46782a);
  return;
}

Assistant:

void SoPlexBase<R>::_performOptIRStable(
   SolRational& sol,
   bool acceptUnbounded,
   bool acceptInfeasible,
   int minIRRoundsRemaining,
   bool& primalFeasible,
   bool& dualFeasible,
   bool& infeasible,
   bool& unbounded,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error)
{
   assert(boolParam(SoPlexBase<R>::ITERATIVE_REFINEMENT));

   // start rational solving timing
   _statistics->rationalTime->start();

   primalFeasible = false;
   dualFeasible = false;
   infeasible = false;
   unbounded = false;
   stoppedTime = false;
   stoppedIter = false;
   error = false;

   // declare vectors and variables
   typename SPxSolverBase<R>::Status result = SPxSolverBase<R>::UNKNOWN;

   _modLower.reDim(numColsRational(), false);
   _modUpper.reDim(numColsRational(), false);
   _modLhs.reDim(numRowsRational(), false);
   _modRhs.reDim(numRowsRational(), false);
   _modObj.reDim(numColsRational(), false);

   VectorBase<R> primalReal(numColsRational());
   VectorBase<R> dualReal(numRowsRational());

   Rational boundsViolation;
   Rational sideViolation;
   Rational redCostViolation;
   Rational dualViolation;
   Rational primalScale;
   Rational dualScale;
   Rational maxScale;

   // solve original LP
   SPX_MSG_INFO1(spxout, spxout << "Initial floating-point solve . . .\n");

   if(_hasBasis)
   {
      assert(_basisStatusRows.size() == numRowsRational());
      assert(_basisStatusCols.size() == numColsRational());
      _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);
   }

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      assert(_solver.maxRowObj(r) == 0.0);
   }

   _statistics->rationalTime->stop();

   // determine if we should use the recovery mechanism pipeline in case of fails
   if(!boolParam(SoPlexBase<R>::RECOVERY_MECHANISM))
      result = _solveRealForRational(false, primalReal, dualReal, _basisStatusRows, _basisStatusCols);
   else
      result = _solveRealStable(acceptUnbounded, acceptInfeasible, primalReal, dualReal, _basisStatusRows,
                                _basisStatusCols);

   // evalute result
   if(_evaluateResult<R>(_solver, result, false, sol, dualReal, infeasible, unbounded, stoppedTime,
                         stoppedIter,
                         error))
      return;

   _statistics->rationalTime->start();

   int dualSize = 0;

   // stores floating-point solution of original LP as current rational solution
   // ensure that solution vectors have right dimension; ensure that solution is aligned with basis
   _storeRealSolutionAsRational<R>(sol, primalReal, dualReal, dualSize);

   // initial scaling factors are one
   primalScale = _rationalPosone;
   dualScale = _rationalPosone;

   // control progress
   Rational maxViolation;
   Rational bestViolation = _rationalPosInfty;
   const Rational violationImprovementFactor = 16;
   const Rational errorCorrectionFactor = 1.1;
   Rational errorCorrection = 2;
   int numFailedRefinements = 0;

   // store basis status in case solving modified problem failed
   DataArray< typename SPxSolverBase<R>::VarStatus > basisStatusRowsFirst;
   DataArray< typename SPxSolverBase<R>::VarStatus > basisStatusColsFirst;

   // refinement loop
   const bool maximizing = (intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MAXIMIZE);
   const int maxDimRational = numColsRational() > numRowsRational() ? numColsRational() :
                              numRowsRational();
   bool factorSolNewBasis = true;
   int lastStallRefinements = 0;
   int nextRatrecRefinement = 0;

   // used in _ratrecAndOrRatfac to order a break or a continue outside of the function.
   bool breakAfter;
   bool continueAfter;

   do
   {
      // decrement minIRRoundsRemaining counter
      minIRRoundsRemaining--;

      SPxOut::debug(this, "Computing primal violations.\n");

      // computes violation of bounds
      _computeBoundsViolation(sol, boundsViolation);

      // computes violation of sides
      _computeSidesViolation(sol, sideViolation);

      SPxOut::debug(this, "Computing dual violations.\n");

      // compute reduced cost violation
      _computeReducedCostViolation(sol, redCostViolation, maximizing);

      // compute dual violation
      _computeDualViolation(sol, dualViolation, maximizing);

      _modObj = sol._redCost;

      // output violations; the reduced cost violations for artificially introduced slack columns are actually violations of the dual multipliers
      SPX_MSG_INFO1(spxout, spxout
                    << "Max. bound violation = " << boundsViolation.str() << ", ofm = 1e" << orderOfMagnitude(
                       boundsViolation) << "\n"
                    << "Max. row violation = " << sideViolation.str() << ", ofm = 1e" << orderOfMagnitude(
                       sideViolation) << "\n"
                    << "Max. reduced cost violation = " << redCostViolation.str() << ", ofm = 1e" << orderOfMagnitude(
                       redCostViolation) << "\n"
                    << "Max. dual violation = " << dualViolation.str() << ", ofm = 1e" << orderOfMagnitude(
                       dualViolation) << "\n");


      SPxOut::debug(this, "Progress table: {} & {} & {} & {} & {} & {}\n", _statistics->refinements,
                    _statistics->iterations, _statistics->solvingTime->time(), _statistics->rationalTime->time(),
                    boundsViolation > sideViolation ? boundsViolation : sideViolation,
                    redCostViolation > dualViolation ? redCostViolation : dualViolation);

      // check termination criteria for refinement loop
      if(_isRefinementOver(primalFeasible, dualFeasible, boundsViolation, sideViolation, redCostViolation,
                           dualViolation,
                           minIRRoundsRemaining, stoppedTime, stoppedIter, numFailedRefinements))
         break;

      // check refinement progress
      _checkRefinementProgress(boundsViolation, sideViolation, redCostViolation, dualViolation,
                               maxViolation, bestViolation, violationImprovementFactor, numFailedRefinements);

      // perform rational reconstruction and/or factorization
      _ratrecAndOrRatfac(minIRRoundsRemaining, lastStallRefinements, _statistics->refinements,
                         factorSolNewBasis,
                         nextRatrecRefinement,
                         errorCorrectionFactor, errorCorrection, maxViolation,
                         sol, primalFeasible, dualFeasible,
                         stoppedTime, stoppedIter, error, breakAfter, continueAfter);

      if(breakAfter)
         break;
      else if(continueAfter)
         continue;

      // start refinement

      // compute primal scaling factor; limit increase in scaling by tolerance used in floating point solve
      _computePrimalScalingFactor(maxScale, primalScale, boundsViolation, sideViolation,
                                  redCostViolation);

      // apply scaled bounds and scaled sides
      _applyScaledBounds<R>(_solver, primalScale);
      _applyScaledSides<R>(_solver, primalScale);

      // compute dual scaling factor; limit increase in scaling by tolerance used in floating point solve
      _computeDualScalingFactor(maxScale, primalScale, dualScale, redCostViolation, dualViolation);

      // apply scaled objective function
      _applyScaledObj<R>(_solver, dualScale, sol);

      SPX_MSG_INFO1(spxout, spxout << "Refined floating-point solve . . .\n");

      // ensure that artificial slack columns are basic and inequality constraints are nonbasic; otherwise we may end
      // up with dual violation on inequality constraints after removing the slack columns; do not change this in the
      // floating-point solver, though, because the solver may require its original basis to detect optimality
      if(_slackCols.num() > 0 && _hasBasis)
      {
         int numOrigCols = numColsRational() - _slackCols.num();
         assert(_slackCols.num() <= 0 || boolParam(SoPlexBase<R>::EQTRANS));

         for(int i = 0; i < _slackCols.num(); i++)
         {
            int row = _slackCols.colVector(i).index(0);
            int col = numOrigCols + i;

            assert(row >= 0);
            assert(row < numRowsRational());

            if(_basisStatusRows[row] == SPxSolverBase<R>::BASIC
                  && _basisStatusCols[col] != SPxSolverBase<R>::BASIC)
            {
               _basisStatusRows[row] = _basisStatusCols[col];
               _basisStatusCols[col] = SPxSolverBase<R>::BASIC;
               _rationalLUSolver.clear();
            }
         }
      }

      // load basis
      if(_hasBasis && _solver.basis().status() < SPxBasisBase<R>::REGULAR)
      {
         SPxOut::debug(this, "basis (status = {}) desc before set:\n", _solver.basis().status());
#ifdef SOPLEX_DEBUG
         _solver.basis().desc().dump();
#endif
         _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
         SPxOut::debug(this, "basis (status = {}) desc after set:\n", _solver.basis().status());
#ifdef SOPLEX_DEBUG
         _solver.basis().desc().dump();
#endif
         _hasBasis = _solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM;
         SPxOut::debug(this, "setting basis in solver {} (3)\n", (_hasBasis ? "successful" : "failed"));
      }

      // solve modified problem
      int prevIterations = _statistics->iterations;
      _statistics->rationalTime->stop();

      // determine if recovery pipeline should be used
      if(!boolParam(SoPlexBase<R>::RECOVERY_MECHANISM))
      {
         // turn off simplifier if scaling factors are too high
         int simplifier = intParam(SoPlexBase<R>::SIMPLIFIER);

         if(primalScale > 1e20 || dualScale > 1e20)
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         result = _solveRealForRational(false, primalReal, dualReal, _basisStatusRows, _basisStatusCols);
         // reset simplifier param to previous value
         setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);
      }
      else
         result = _solveRealStable(acceptUnbounded, acceptInfeasible, primalReal, dualReal, _basisStatusRows,
                                   _basisStatusCols, primalScale > 1e20 || dualScale > 1e20);

      // count refinements and remember whether we moved to a new basis
      _statistics->refinements++;

      if(_statistics->iterations <= prevIterations)
      {
         lastStallRefinements++;
         _statistics->stallRefinements++;
      }
      else
      {
         factorSolNewBasis = true;
         lastStallRefinements = 0;
         _statistics->pivotRefinements = _statistics->refinements;
      }

      // evaluate result; if modified problem was not solved to optimality, stop refinement;
      if(_evaluateResult<R>(_solver, result, true, sol, dualReal, infeasible, unbounded, stoppedTime,
                            stoppedIter,
                            error))
         return;

      _statistics->rationalTime->start();

      int primalSize;

      // correct primal solution and align with basis
      _correctPrimalSolution<R>(sol, primalScale, primalSize, maxDimRational, primalReal);

      // update or recompute slacks depending on which looks faster
      _updateSlacks(sol, primalSize);

      const int numCorrectedPrimals = _primalDualDiff.size();

      // correct dual solution and align with basis
      _correctDualSolution<R>(_solver, sol, maximizing, dualReal, dualScale, dualSize, maxDimRational);

      // update or recompute reduced cost values depending on which looks faster
      // adding one to the length of the dual vector accounts for the objective function vector
      _updateReducedCosts(sol, dualSize, numCorrectedPrimals);
   }
   while(true);

   // correct basis status for restricted inequalities
   if(_hasBasis)
   {
      for(int r = numRowsRational() - 1; r >= 0; r--)
      {
         assert((lhsRational(r) == rhsRational(r)) == (_rowTypes[r] == RANGETYPE_FIXED));

         if(_rowTypes[r] != RANGETYPE_FIXED && _basisStatusRows[r] == SPxSolverBase<R>::FIXED)
            _basisStatusRows[r] = (maximizing == (sol._dual[r] < 0))
                                  ? SPxSolverBase<R>::ON_LOWER
                                  : SPxSolverBase<R>::ON_UPPER;
      }
   }

   // compute objective function values
   assert(sol._isPrimalFeasible == sol._isDualFeasible);

   if(sol._isPrimalFeasible)
   {
      sol._objVal = sol._primal * _rationalLP->maxObj();

      if(intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MINIMIZE)
         sol._objVal *= -1;
   }

   // set objective coefficients for all rows to zero
   _solver.clearRowObjs();

   // stop rational solving time
   _statistics->rationalTime->stop();
}